

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall HPresolve::removeImpliedFreeColumn(HPresolve *this,int col,int i,int k)

{
  int *piVar1;
  iterator *piVar2;
  double *__args;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  double *pdVar7;
  _Elt_pointer pcVar8;
  ostream *poVar9;
  pointer piVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> newCosts;
  pair<int,_double> local_70;
  ulong local_60;
  value_type local_58;
  ulong local_40;
  ulong local_38;
  
  if (0 < this->iPrint) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PR: Implied free column singleton ",0x22);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,col);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," removed.  Row ",0xf);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,i);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," removed.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  piVar1 = (this->countRemovedCols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 9;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->countRemovedRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 9;
  *piVar1 = *piVar1 + 1;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pair<int,_double> *)0x0;
  local_58.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pair<int,_double> *)0x0;
  uVar14 = (ulong)i;
  piVar3 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar15 = uVar14;
  if (uVar14 < (ulong)((long)(this->super_HPreData).ARstart.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
    uVar13 = (ulong)(i + 1);
    piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar15 = uVar13;
    local_38 = (ulong)(uint)i;
    if (uVar13 < (ulong)((long)(this->super_HPreData).ARstart.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar10 >> 2)) {
      uVar16 = (ulong)piVar3[uVar14];
      local_60 = (ulong)col;
      uVar17 = (ulong)k;
      local_40 = uVar14;
      do {
        uVar14 = local_38;
        uVar15 = local_40;
        if ((long)piVar10[uVar13] <= (long)uVar16) {
          if (this->iKKTcheck == 1) {
            std::
            deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
            ::push_back(&(this->super_HPreData).chk.costs.c,&local_58);
          }
          uVar16 = (ulong)col;
          piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar13 = uVar16;
          if (uVar16 < (ulong)((long)(this->super_HPreData).flagCol.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar3 >> 2)) {
            piVar3[uVar16] = 0;
            pdVar4 = (this->super_HPreData).colCost.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (uVar16 < (ulong)((long)(this->super_HPreData).colCost.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
              __args = pdVar4 + uVar16;
              pdVar7 = (this->super_HPreData).postValue.c.
                       super__Deque_base<double,_std::allocator<double>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_cur;
              if (pdVar7 == *(_Elt_pointer *)
                             ((long)&(this->super_HPreData).postValue.c.
                                     super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                     super__Deque_impl_data._M_finish + 0x10) + -1) {
                std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                          ((deque<double,std::allocator<double>> *)&(this->super_HPreData).postValue
                           ,__args);
              }
              else {
                *pdVar7 = *__args;
                (this->super_HPreData).postValue.c.
                super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
                _M_finish._M_cur = pdVar7 + 1;
              }
              iVar12 = (int)uVar14;
              fillStackRowBounds(this,iVar12);
              pdVar4 = (this->super_HPreData).valueColDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (uVar16 < (ulong)((long)(this->super_HPreData).valueColDual.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
                pdVar4[uVar16] = 0.0;
                pdVar4 = (this->super_HPreData).colCost.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (uVar16 < (ulong)((long)(this->super_HPreData).colCost.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4
                                    >> 3)) {
                  uVar14 = (ulong)k;
                  pdVar5 = (this->super_HPreData).Avalue.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  uVar13 = uVar14;
                  if ((uVar14 < (ulong)((long)(this->super_HPreData).Avalue.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pdVar5 >> 3)) &&
                     (pdVar6 = (this->super_HPreData).valueRowDual.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start, uVar13 = uVar15,
                     uVar15 < (ulong)((long)(this->super_HPreData).valueRowDual.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6
                                     >> 3))) {
                    pdVar6[uVar15] = -pdVar4[uVar16] / pdVar5[uVar14];
                    local_70.first = 9;
                    local_70.second = (double)CONCAT44(local_70.second._4_4_,col);
                    pcVar8 = (this->super_HPreData).chng.c.
                             super__Deque_base<change,_std::allocator<change>_>._M_impl.
                             super__Deque_impl_data._M_finish._M_cur;
                    local_70._4_4_ = iVar12;
                    if (pcVar8 == *(_Elt_pointer *)
                                   ((long)&(this->super_HPreData).chng.c.
                                           super__Deque_base<change,_std::allocator<change>_>.
                                           _M_impl.super__Deque_impl_data._M_finish + 0x10) + -1) {
                      std::deque<change,std::allocator<change>>::_M_push_back_aux<change_const&>
                                ((deque<change,std::allocator<change>> *)
                                 &(this->super_HPreData).chng,(change *)&local_70);
                    }
                    else {
                      pcVar8->col = col;
                      pcVar8->type = 9;
                      pcVar8->row = iVar12;
                      piVar2 = &(this->super_HPreData).chng.c.
                                super__Deque_base<change,_std::allocator<change>_>._M_impl.
                                super__Deque_impl_data._M_finish;
                      piVar2->_M_cur = piVar2->_M_cur + 1;
                    }
                    removeRow(this,iVar12);
                    if (local_58.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_58.
                                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                    }
                    return;
                  }
                }
              }
            }
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar13);
        }
        piVar3 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = uVar16;
        if ((ulong)((long)(this->super_HPreData).ARindex.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar16) break;
        iVar12 = piVar3[uVar16];
        uVar14 = (ulong)iVar12;
        piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar15 = uVar14;
        if ((ulong)((long)(this->super_HPreData).flagCol.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar14) break;
        if ((iVar12 != col) && (piVar3[uVar14] != 0)) {
          pdVar4 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->super_HPreData).colCost.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar4 >> 3) <= uVar14) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar14);
          }
          local_70.second = pdVar4[uVar14];
          local_70.first = iVar12;
          if (local_58.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_58.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
            _M_realloc_insert<std::pair<int,double>>
                      ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                       &local_58,
                       (iterator)
                       local_58.
                       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_70);
          }
          else {
            *(ulong *)local_58.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = CONCAT44(local_70._4_4_,iVar12);
            (local_58.
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->second = local_70.second;
            local_58.
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_58.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pdVar4 = (this->super_HPreData).colCost.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = (long)(this->super_HPreData).colCost.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
          if ((((uVar11 <= uVar14) || (uVar15 = local_60, uVar11 <= local_60)) ||
              (pdVar5 = (this->super_HPreData).ARvalue.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start, uVar15 = uVar16,
              (ulong)((long)(this->super_HPreData).ARvalue.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar5 >> 3) <= uVar16)) ||
             (pdVar6 = (this->super_HPreData).Avalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start, uVar15 = uVar17,
             (ulong)((long)(this->super_HPreData).Avalue.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar6 >> 3) <= uVar17)) break;
          pdVar4[uVar14] = pdVar4[uVar14] - (pdVar4[local_60] * pdVar5[uVar16]) / pdVar6[uVar17];
        }
        uVar16 = uVar16 + 1;
        piVar10 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar15 = uVar13;
      } while (uVar13 < (ulong)((long)(this->super_HPreData).ARstart.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)piVar10 >> 2));
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15);
}

Assistant:

void HPresolve::removeImpliedFreeColumn(const int col, const int i, const int k) {
	if (iPrint > 0)
		cout << "PR: Implied free column singleton " << col << " removed.  Row "
				<< i << " removed." << endl;

	countRemovedCols[IMPLIED_FREE_SING_COL]++;
	countRemovedRows[IMPLIED_FREE_SING_COL]++;

	//modify costs
	int j;
	vector<pair<int, double> > newCosts;
	for (int kk = ARstart.at(i); kk < ARstart.at(i + 1); ++kk) {
		j = ARindex.at(kk);
		if (flagCol.at(j) && j != col) {
			newCosts.push_back(make_pair(j, colCost.at(j)));
			colCost.at(j) = colCost.at(j)
					- colCost.at(col) * ARvalue.at(kk) / Avalue.at(k);
		}
	}
	if (iKKTcheck == 1)
		chk.costs.push(newCosts);

	flagCol.at(col) = 0;
	postValue.push(colCost.at(col));
	fillStackRowBounds(i);

	valueColDual.at(col) = 0;
	valueRowDual.at(i) = -colCost.at(col) / Avalue.at(k);
	addChange(IMPLIED_FREE_SING_COL, i, col);
	removeRow(i);
}